

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::SimpleCompute::Run(SimpleCompute *this)

{
  CallLogWrapper *this_00;
  undefined1 auVar1 [16];
  undefined4 extraout_EAX;
  int iVar2;
  Vector<float,_4> *v;
  Vector<float,_4> VStack_38;
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
  glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_buffer);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  v = (Vector<float,_4> *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x10,1);
  tcu::Vector<float,_4>::Vector(&VStack_38,v);
  auVar1._4_4_ = -(uint)(VStack_38.m_data[1] != 2.0);
  auVar1._0_4_ = -(uint)(VStack_38.m_data[0] != 1.0);
  auVar1._8_4_ = -(uint)(VStack_38.m_data[2] != 3.0);
  auVar1._12_4_ = -(uint)(VStack_38.m_data[3] != 4.0);
  iVar2 = movmskps(extraout_EAX,auVar1);
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  return -(ulong)(iVar2 != 0);
}

Assistant:

virtual long Run()
	{
		glUseProgram(m_program);
		glDispatchCompute(1, 1, 1);

		vec4* data;
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		data	   = static_cast<vec4*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(vec4), GL_MAP_READ_BIT));
		long error = NO_ERROR;
		if (!IsEqual(data[0], vec4(1.0f, 2.0f, 3.0f, 4.0f)))
		{
			error = ERROR;
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		return error;
	}